

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall
cmComputeLinkInformation::cmComputeLinkInformation
          (cmComputeLinkInformation *this,cmGeneratorTarget *target,string *config)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  TargetType TVar2;
  PolicyStatus PVar3;
  cmMakefile *pcVar4;
  cmLocalGenerator *this_01;
  cmGlobalGenerator *pcVar5;
  cmake *pcVar6;
  cmState *this_02;
  ulong uVar7;
  string *psVar8;
  pointer pcVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>,_bool>
  pVar10;
  allocator<char> local_ac1;
  string local_ac0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_aa0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a98;
  undefined1 local_a90 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directories;
  allocator<char> local_a69;
  string local_a68;
  allocator<char> local_a41;
  string local_a40;
  allocator<char> local_a19;
  string local_a18;
  _Base_ptr local_9f8;
  undefined1 local_9f0;
  allocator<char> local_9e1;
  string local_9e0;
  allocator<char> local_9b9;
  string local_9b8;
  LibraryFeatureDescriptor local_998;
  _Base_ptr local_8f0;
  undefined1 local_8e8;
  cmAlphaNum local_8e0;
  string *local_8b0;
  cmAlphaNum local_8a8;
  string local_878;
  allocator<char> local_851;
  string local_850;
  LibraryFeatureDescriptor local_830;
  _Base_ptr local_788;
  undefined1 local_780;
  cmAlphaNum local_778;
  cmAlphaNum local_748;
  string local_718;
  allocator<char> local_6f1;
  string local_6f0;
  LibraryFeatureDescriptor local_6d0;
  _Base_ptr local_628;
  undefined1 local_620;
  cmAlphaNum local_618;
  cmAlphaNum local_5e8;
  string local_5b8;
  allocator<char> local_591;
  string local_590;
  LibraryFeatureDescriptor local_570;
  cmAlphaNum local_4c8;
  cmAlphaNum local_498;
  undefined1 local_468 [8];
  string var;
  cmAlphaNum local_418;
  undefined1 local_3e8 [8];
  string rlVar;
  string local_3c0;
  undefined1 local_3a0 [8];
  string rtSepVar;
  cmAlphaNum local_350;
  undefined1 local_320 [8];
  string rtVar;
  char *tType;
  string local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  cmValue local_290;
  cmValue flag_2;
  string local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  cmValue local_220;
  cmValue suffix;
  string local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  cmValue local_1b0;
  cmValue flag_1;
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  cmValue local_140;
  cmValue flag;
  cmAlphaNum local_130;
  cmAlphaNum local_100;
  undefined1 local_d0 [8];
  string loader_flag_var;
  string local_a8;
  string local_88;
  unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_> local_68;
  unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_> local_60;
  allocator<char> local_51;
  string local_50;
  string *local_20;
  string *config_local;
  cmGeneratorTarget *target_local;
  cmComputeLinkInformation *this_local;
  
  local_20 = config;
  config_local = (string *)target;
  target_local = (cmGeneratorTarget *)this;
  std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
  vector(&this->Items);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Directories);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Depends);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->FrameworkPaths);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->RuntimeSearchPath);
  std::
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::set(&this->SharedLibrariesLinked);
  std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::vector
            (&this->RuntimeDLLs);
  this->Target = (cmGeneratorTarget *)config_local;
  pcVar4 = cmTarget::GetMakefile(*(cmTarget **)config_local);
  this->Makefile = pcVar4;
  this_01 = cmGeneratorTarget::GetLocalGenerator((cmGeneratorTarget *)config_local);
  pcVar5 = cmLocalGenerator::GetGlobalGenerator(this_01);
  this->GlobalGenerator = pcVar5;
  pcVar6 = cmGlobalGenerator::GetCMakeInstance(this->GlobalGenerator);
  this->CMakeInstance = pcVar6;
  std::__cxx11::string::string((string *)&this->Config,(string *)local_20);
  std::__cxx11::string::string((string *)&this->LinkLanguage);
  cmValue::cmValue(&this->LoaderFlag);
  std::__cxx11::string::string((string *)&this->LibLinkFlag);
  std::__cxx11::string::string((string *)&this->LibLinkFileFlag);
  std::__cxx11::string::string((string *)&this->ObjLinkFileFlag);
  std::__cxx11::string::string((string *)&this->LibLinkSuffix);
  std::__cxx11::string::string((string *)&this->RuntimeFlag);
  std::__cxx11::string::string((string *)&this->RuntimeSep);
  std::__cxx11::string::string((string *)&this->RuntimeAlways);
  std::__cxx11::string::string((string *)&this->RPathLinkFlag);
  std::__cxx11::string::string((string *)&this->StaticLinkTypeFlag);
  std::__cxx11::string::string((string *)&this->SharedLinkTypeFlag);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->StaticLinkExtensions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->SharedLinkExtensions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->LinkExtensions);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->LinkPrefixes);
  cmsys::RegularExpression::RegularExpression(&this->ExtractStaticLibraryName);
  cmsys::RegularExpression::RegularExpression(&this->ExtractSharedLibraryName);
  cmsys::RegularExpression::RegularExpression(&this->ExtractAnyLibraryName);
  std::__cxx11::string::string((string *)&this->SharedRegexString);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->FrameworkPathsEmitted);
  std::unique_ptr<cmOrderDirectories,std::default_delete<cmOrderDirectories>>::
  unique_ptr<std::default_delete<cmOrderDirectories>,void>
            ((unique_ptr<cmOrderDirectories,std::default_delete<cmOrderDirectories>> *)
             &this->OrderLinkerSearchPath);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ImplicitLinkDirs);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ImplicitLinkLibs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->RuntimeLinkDirs);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->OldLinkDirMask);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->OldLinkDirItems);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->OldUserFlagItems);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->CMP0060WarnItems);
  std::unique_ptr<cmOrderDirectories,std::default_delete<cmOrderDirectories>>::
  unique_ptr<std::default_delete<cmOrderDirectories>,void>
            ((unique_ptr<cmOrderDirectories,std::default_delete<cmOrderDirectories>> *)
             &this->OrderDependentRPath);
  std::unique_ptr<cmOrderDirectories,std::default_delete<cmOrderDirectories>>::
  unique_ptr<std::default_delete<cmOrderDirectories>,void>
            ((unique_ptr<cmOrderDirectories,std::default_delete<cmOrderDirectories>> *)
             &this->OrderRuntimeSearchPath);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
  ::map(&this->LibraryFeatureDescriptors);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
  ::map(&this->GroupFeatureDescriptors);
  this_02 = cmMakefile::GetState(this->Makefile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"FIND_LIBRARY_USE_OPENBSD_VERSIONING",&local_51);
  bVar1 = cmState::GetGlobalPropertyAsBool(this_02,&local_50);
  this->OpenBSD = bVar1;
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  std::
  make_unique<cmOrderDirectories,cmGlobalGenerator*const&,cmGeneratorTarget_const*&,char_const(&)[19]>
            ((cmGlobalGenerator **)&local_60,(cmGeneratorTarget **)&this->GlobalGenerator,
             (char (*) [19])&config_local);
  std::unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::operator=
            (&this->OrderLinkerSearchPath,&local_60);
  std::unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::~unique_ptr
            (&local_60);
  std::
  make_unique<cmOrderDirectories,cmGlobalGenerator*const&,cmGeneratorTarget_const*&,char_const(&)[20]>
            ((cmGlobalGenerator **)&local_68,(cmGeneratorTarget **)&this->GlobalGenerator,
             (char (*) [20])&config_local);
  std::unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::operator=
            (&this->OrderRuntimeSearchPath,&local_68);
  std::unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::~unique_ptr
            (&local_68);
  cmGeneratorTarget::GetLinkerLanguage(&local_88,this->Target,local_20);
  std::__cxx11::string::operator=((string *)&this->LinkLanguage,(string *)&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    this_00 = this->Target;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"LINK_DEPENDS_NO_SHARED",
               (allocator<char> *)(loader_flag_var.field_2._M_local_buf + 0xf));
    bVar1 = cmGeneratorTarget::GetPropertyAsBool(this_00,&local_a8);
    this->LinkDependsNoShared = bVar1;
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator
              ((allocator<char> *)(loader_flag_var.field_2._M_local_buf + 0xf));
    bVar1 = cmGeneratorTarget::IsDLLPlatform(this->Target);
    if ((!bVar1) && (TVar2 = cmGeneratorTarget::GetType(this->Target), TVar2 == MODULE_LIBRARY)) {
      cmAlphaNum::cmAlphaNum(&local_100,"CMAKE_SHARED_MODULE_LOADER_");
      cmAlphaNum::cmAlphaNum(&local_130,&this->LinkLanguage);
      cmStrCat<char[6]>((string *)local_d0,&local_100,&local_130,(char (*) [6])0xc369c7);
      flag = cmMakefile::GetDefinition(this->Makefile,(string *)local_d0);
      (this->LoaderFlag).Value = flag.Value;
      std::__cxx11::string::~string((string *)local_d0);
    }
    pcVar4 = this->Makefile;
    std::operator+(&local_180,"CMAKE_",&this->LinkLanguage);
    std::operator+(&local_160,&local_180,"_LINK_LIBRARY_FLAG");
    local_140 = cmMakefile::GetDefinition(pcVar4,&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_180);
    bVar1 = cmValue::operator_cast_to_bool(&local_140);
    if (bVar1) {
      psVar8 = cmValue::operator*[abi_cxx11_(&local_140);
      std::__cxx11::string::operator=((string *)&this->LibLinkFlag,(string *)psVar8);
    }
    else {
      pcVar4 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a0,"CMAKE_LINK_LIBRARY_FLAG",
                 (allocator<char> *)((long)&flag_1.Value + 7));
      psVar8 = cmMakefile::GetSafeDefinition(pcVar4,&local_1a0);
      std::__cxx11::string::operator=((string *)&this->LibLinkFlag,(string *)psVar8);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&flag_1.Value + 7));
    }
    pcVar4 = this->Makefile;
    std::operator+(&local_1f0,"CMAKE_",&this->LinkLanguage);
    std::operator+(&local_1d0,&local_1f0,"_LINK_LIBRARY_FILE_FLAG");
    local_1b0 = cmMakefile::GetDefinition(pcVar4,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1f0);
    bVar1 = cmValue::operator_cast_to_bool(&local_1b0);
    if (bVar1) {
      psVar8 = cmValue::operator*[abi_cxx11_(&local_1b0);
      std::__cxx11::string::operator=((string *)&this->LibLinkFileFlag,(string *)psVar8);
    }
    else {
      pcVar4 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_210,"CMAKE_LINK_LIBRARY_FILE_FLAG",
                 (allocator<char> *)((long)&suffix.Value + 7));
      psVar8 = cmMakefile::GetSafeDefinition(pcVar4,&local_210);
      std::__cxx11::string::operator=((string *)&this->LibLinkFileFlag,(string *)psVar8);
      std::__cxx11::string::~string((string *)&local_210);
      std::allocator<char>::~allocator((allocator<char> *)((long)&suffix.Value + 7));
    }
    pcVar4 = this->Makefile;
    std::operator+(&local_260,"CMAKE_",&this->LinkLanguage);
    std::operator+(&local_240,&local_260,"_LINK_LIBRARY_SUFFIX");
    local_220 = cmMakefile::GetDefinition(pcVar4,&local_240);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_260);
    bVar1 = cmValue::operator_cast_to_bool(&local_220);
    if (bVar1) {
      psVar8 = cmValue::operator*[abi_cxx11_(&local_220);
      std::__cxx11::string::operator=((string *)&this->LibLinkSuffix,(string *)psVar8);
    }
    else {
      pcVar4 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_280,"CMAKE_LINK_LIBRARY_SUFFIX",
                 (allocator<char> *)((long)&flag_2.Value + 7));
      psVar8 = cmMakefile::GetSafeDefinition(pcVar4,&local_280);
      std::__cxx11::string::operator=((string *)&this->LibLinkSuffix,(string *)psVar8);
      std::__cxx11::string::~string((string *)&local_280);
      std::allocator<char>::~allocator((allocator<char> *)((long)&flag_2.Value + 7));
    }
    pcVar4 = this->Makefile;
    std::operator+(&local_2d0,"CMAKE_",&this->LinkLanguage);
    std::operator+(&local_2b0,&local_2d0,"_LINK_OBJECT_FILE_FLAG");
    local_290 = cmMakefile::GetDefinition(pcVar4,&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_2d0);
    bVar1 = cmValue::operator_cast_to_bool(&local_290);
    if (bVar1) {
      psVar8 = cmValue::operator*[abi_cxx11_(&local_290);
      std::__cxx11::string::operator=((string *)&this->ObjLinkFileFlag,(string *)psVar8);
    }
    else {
      pcVar4 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2f0,"CMAKE_LINK_OBJECT_FILE_FLAG",
                 (allocator<char> *)((long)&tType + 7));
      psVar8 = cmMakefile::GetSafeDefinition(pcVar4,&local_2f0);
      std::__cxx11::string::operator=((string *)&this->ObjLinkFileFlag,(string *)psVar8);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&tType + 7));
    }
    this->RuntimeUseChrpath = false;
    TVar2 = cmGeneratorTarget::GetType(this->Target);
    if (TVar2 != STATIC_LIBRARY) {
      TVar2 = cmGeneratorTarget::GetType(this->Target);
      rtVar.field_2._8_8_ = "SHARED_LIBRARY";
      if (TVar2 == EXECUTABLE) {
        rtVar.field_2._8_8_ = "EXECUTABLE";
      }
      cmAlphaNum::cmAlphaNum(&local_350,"CMAKE_");
      cmAlphaNum::cmAlphaNum
                ((cmAlphaNum *)((long)&rtSepVar.field_2 + 8),(char *)rtVar.field_2._8_8_);
      cmStrCat<char[10],std::__cxx11::string,char[6]>
                ((string *)local_320,&local_350,(cmAlphaNum *)((long)&rtSepVar.field_2 + 8),
                 (char (*) [10])0xc4bfb8,&this->LinkLanguage,(char (*) [6])0xc369c7);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320,
                     "_SEP");
      psVar8 = cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_320);
      std::__cxx11::string::operator=((string *)&this->RuntimeFlag,(string *)psVar8);
      psVar8 = cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_3a0);
      std::__cxx11::string::operator=((string *)&this->RuntimeSep,(string *)psVar8);
      pcVar4 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3c0,"CMAKE_PLATFORM_REQUIRED_RUNTIME_PATH",
                 (allocator<char> *)(rlVar.field_2._M_local_buf + 0xf));
      psVar8 = cmMakefile::GetSafeDefinition(pcVar4,&local_3c0);
      std::__cxx11::string::operator=((string *)&this->RuntimeAlways,(string *)psVar8);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::allocator<char>::~allocator((allocator<char> *)(rlVar.field_2._M_local_buf + 0xf));
      bVar1 = cmGeneratorTarget::IsChrpathUsed(this->Target,local_20);
      this->RuntimeUseChrpath = bVar1;
      cmAlphaNum::cmAlphaNum(&local_418,"CMAKE_");
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&var.field_2 + 8),(char *)rtVar.field_2._8_8_);
      cmStrCat<char[13],std::__cxx11::string,char[6]>
                ((string *)local_3e8,&local_418,(cmAlphaNum *)((long)&var.field_2 + 8),
                 (char (*) [13])"_RPATH_LINK_",&this->LinkLanguage,(char (*) [6])0xc369c7);
      psVar8 = cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_3e8);
      std::__cxx11::string::operator=((string *)&this->RPathLinkFlag,(string *)psVar8);
      std::__cxx11::string::~string((string *)local_3e8);
      std::__cxx11::string::~string((string *)local_3a0);
      std::__cxx11::string::~string((string *)local_320);
    }
    cmAlphaNum::cmAlphaNum(&local_498,"CMAKE_SHARED_LIBRARY_LINK_");
    cmAlphaNum::cmAlphaNum(&local_4c8,&this->LinkLanguage);
    cmStrCat<char[19]>((string *)local_468,&local_498,&local_4c8,(char (*) [19])"_WITH_RUNTIME_PATH"
                      );
    bVar1 = cmMakefile::IsOn(this->Makefile,(string *)local_468);
    this->LinkWithRuntimePath = bVar1;
    std::__cxx11::string::~string((string *)local_468);
    GetLibLinkFileFlag_abi_cxx11_(this);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_590,"__CMAKE_LINK_LIBRARY",&local_591);
      psVar8 = GetLibLinkFileFlag_abi_cxx11_(this);
      cmAlphaNum::cmAlphaNum(&local_5e8,psVar8);
      cmAlphaNum::cmAlphaNum(&local_618,"<LIBRARY>");
      cmStrCat<>(&local_5b8,&local_5e8,&local_618);
      LibraryFeatureDescriptor::LibraryFeatureDescriptor(&local_570,&local_590,&local_5b8);
      pVar10 = std::
               map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
               ::emplace<char_const(&)[21],cmComputeLinkInformation::LibraryFeatureDescriptor>
                         ((map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                           *)&this->LibraryFeatureDescriptors,(char (*) [21])"__CMAKE_LINK_LIBRARY",
                          &local_570);
      local_628 = (_Base_ptr)pVar10.first._M_node;
      local_620 = pVar10.second;
      LibraryFeatureDescriptor::~LibraryFeatureDescriptor(&local_570);
      std::__cxx11::string::~string((string *)&local_5b8);
      std::__cxx11::string::~string((string *)&local_590);
      std::allocator<char>::~allocator(&local_591);
    }
    GetObjLinkFileFlag_abi_cxx11_(this);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6f0,"__CMAKE_LINK_OBJECT",&local_6f1);
      psVar8 = GetObjLinkFileFlag_abi_cxx11_(this);
      cmAlphaNum::cmAlphaNum(&local_748,psVar8);
      cmAlphaNum::cmAlphaNum(&local_778,"<LIBRARY>");
      cmStrCat<>(&local_718,&local_748,&local_778);
      LibraryFeatureDescriptor::LibraryFeatureDescriptor(&local_6d0,&local_6f0,&local_718);
      pVar10 = std::
               map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
               ::emplace<char_const(&)[20],cmComputeLinkInformation::LibraryFeatureDescriptor>
                         ((map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                           *)&this->LibraryFeatureDescriptors,(char (*) [20])"__CMAKE_LINK_OBJECT",
                          &local_6d0);
      local_788 = (_Base_ptr)pVar10.first._M_node;
      local_780 = pVar10.second;
      LibraryFeatureDescriptor::~LibraryFeatureDescriptor(&local_6d0);
      std::__cxx11::string::~string((string *)&local_718);
      std::__cxx11::string::~string((string *)&local_6f0);
      std::allocator<char>::~allocator(&local_6f1);
    }
    cmValue::operator->[abi_cxx11_(&this->LoaderFlag);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_850,"__CMAKE_LINK_EXECUTABLE",&local_851);
      local_8b0 = (this->LoaderFlag).Value;
      cmAlphaNum::cmAlphaNum(&local_8a8,(cmValue)local_8b0);
      cmAlphaNum::cmAlphaNum(&local_8e0,"<LIBRARY>");
      cmStrCat<>(&local_878,&local_8a8,&local_8e0);
      LibraryFeatureDescriptor::LibraryFeatureDescriptor(&local_830,&local_850,&local_878);
      pVar10 = std::
               map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
               ::emplace<char_const(&)[24],cmComputeLinkInformation::LibraryFeatureDescriptor>
                         ((map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                           *)&this->LibraryFeatureDescriptors,
                          (char (*) [24])"__CMAKE_LINK_EXECUTABLE",&local_830);
      local_8f0 = (_Base_ptr)pVar10.first._M_node;
      local_8e8 = pVar10.second;
      LibraryFeatureDescriptor::~LibraryFeatureDescriptor(&local_830);
      std::__cxx11::string::~string((string *)&local_878);
      std::__cxx11::string::~string((string *)&local_850);
      std::allocator<char>::~allocator(&local_851);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9b8,"__CMAKE_LINK_FRAMEWORK",&local_9b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_9e0,"<LIBRARY>",&local_9e1);
    LibraryFeatureDescriptor::LibraryFeatureDescriptor(&local_998,&local_9b8,&local_9e0);
    pVar10 = std::
             map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
             ::emplace<char_const(&)[23],cmComputeLinkInformation::LibraryFeatureDescriptor>
                       ((map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                         *)&this->LibraryFeatureDescriptors,(char (*) [23])"__CMAKE_LINK_FRAMEWORK",
                        &local_998);
    local_9f8 = (_Base_ptr)pVar10.first._M_node;
    local_9f0 = pVar10.second;
    LibraryFeatureDescriptor::~LibraryFeatureDescriptor(&local_998);
    std::__cxx11::string::~string((string *)&local_9e0);
    std::allocator<char>::~allocator(&local_9e1);
    std::__cxx11::string::~string((string *)&local_9b8);
    std::allocator<char>::~allocator(&local_9b9);
    pcVar4 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a18,"CMAKE_PLATFORM_USES_PATH_WHEN_NO_SONAME",&local_a19);
    bVar1 = cmMakefile::IsOn(pcVar4,&local_a18);
    this->NoSONameUsesPath = bVar1;
    std::__cxx11::string::~string((string *)&local_a18);
    std::allocator<char>::~allocator(&local_a19);
    ComputeLinkTypeInfo(this);
    ComputeItemParserInfo(this);
    ComputeFrameworkInfo(this);
    this->SharedDependencyMode = SharedDepModeNone;
    pcVar4 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a40,"CMAKE_LINK_DEPENDENT_LIBRARY_FILES",&local_a41);
    bVar1 = cmMakefile::IsOn(pcVar4,&local_a40);
    std::__cxx11::string::~string((string *)&local_a40);
    std::allocator<char>::~allocator(&local_a41);
    if (bVar1) {
      this->SharedDependencyMode = SharedDepModeLink;
    }
    else {
      pcVar4 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a68,"CMAKE_LINK_DEPENDENT_LIBRARY_DIRS",&local_a69);
      bVar1 = cmMakefile::IsOn(pcVar4,&local_a68);
      std::__cxx11::string::~string((string *)&local_a68);
      std::allocator<char>::~allocator(&local_a69);
      if (bVar1) {
        this->SharedDependencyMode = SharedDepModeLibDir;
      }
      else {
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) == 0) {
          this->SharedDependencyMode = SharedDepModeDir;
          std::
          make_unique<cmOrderDirectories,cmGlobalGenerator*const&,cmGeneratorTarget_const*&,char_const(&)[23]>
                    ((cmGlobalGenerator **)
                     &directories.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (cmGeneratorTarget **)&this->GlobalGenerator,(char (*) [23])&config_local);
          std::unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::operator=
                    (&this->OrderDependentRPath,
                     (unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_> *)
                     &directories.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::~unique_ptr
                    ((unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_> *)
                     &directories.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_a90);
    cmGeneratorTarget::GetLinkDirectories
              (this->Target,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_a90,local_20,&this->LinkLanguage);
    pcVar9 = std::unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::
             operator->(&this->OrderLinkerSearchPath);
    cmOrderDirectories::AddUserDirectories
              (pcVar9,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_a90);
    pcVar9 = std::unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::
             operator->(&this->OrderRuntimeSearchPath);
    cmOrderDirectories::AddUserDirectories
              (pcVar9,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_a90);
    LoadImplicitLinkInfo(this);
    pcVar9 = std::unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::
             operator->(&this->OrderLinkerSearchPath);
    cmOrderDirectories::SetImplicitDirectories(pcVar9,&this->ImplicitLinkDirs);
    pcVar9 = std::unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::
             operator->(&this->OrderRuntimeSearchPath);
    cmOrderDirectories::SetImplicitDirectories(pcVar9,&this->ImplicitLinkDirs);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->OrderDependentRPath);
    if (bVar1) {
      pcVar9 = std::unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::
               operator->(&this->OrderDependentRPath);
      cmOrderDirectories::SetImplicitDirectories(pcVar9,&this->ImplicitLinkDirs);
      pcVar9 = std::unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::
               operator->(&this->OrderDependentRPath);
      cmOrderDirectories::AddLanguageDirectories(pcVar9,&this->RuntimeLinkDirs);
    }
    PVar3 = cmGeneratorTarget::GetPolicyStatusCMP0003(this->Target);
    this->OldLinkDirMode = PVar3 != NEW;
    if ((this->OldLinkDirMode & 1U) != 0) {
      local_a98._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_a90);
      local_aa0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_a90);
      std::
      set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::
      insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->OldLinkDirMask,local_a98,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )local_aa0);
    }
    pcVar4 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ac0,"CMAKE_POLICY_WARNING_CMP0060",&local_ac1);
    bVar1 = cmMakefile::PolicyOptionalWarningEnabled(pcVar4,&local_ac0);
    this->CMP0060Warn = bVar1;
    std::__cxx11::string::~string((string *)&local_ac0);
    std::allocator<char>::~allocator(&local_ac1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_a90);
  }
  return;
}

Assistant:

cmComputeLinkInformation::cmComputeLinkInformation(
  const cmGeneratorTarget* target, const std::string& config)
  // Store context information.
  : Target(target)
  , Makefile(target->Target->GetMakefile())
  , GlobalGenerator(target->GetLocalGenerator()->GetGlobalGenerator())
  , CMakeInstance(this->GlobalGenerator->GetCMakeInstance())
  // The configuration being linked.
  , Config(config)
{
  // Check whether to recognize OpenBSD-style library versioned names.
  this->OpenBSD = this->Makefile->GetState()->GetGlobalPropertyAsBool(
    "FIND_LIBRARY_USE_OPENBSD_VERSIONING");

  // Allocate internals.
  this->OrderLinkerSearchPath = cm::make_unique<cmOrderDirectories>(
    this->GlobalGenerator, target, "linker search path");
  this->OrderRuntimeSearchPath = cm::make_unique<cmOrderDirectories>(
    this->GlobalGenerator, target, "runtime search path");

  // Get the language used for linking this target.
  this->LinkLanguage = this->Target->GetLinkerLanguage(config);
  if (this->LinkLanguage.empty()) {
    // The Compute method will do nothing, so skip the rest of the
    // initialization.
    return;
  }

  // Check whether we should skip dependencies on shared library files.
  this->LinkDependsNoShared =
    this->Target->GetPropertyAsBool("LINK_DEPENDS_NO_SHARED");

  // On platforms without import libraries there may be a special flag
  // to use when creating a plugin (module) that obtains symbols from
  // the program that will load it.
  if (!this->Target->IsDLLPlatform() &&
      this->Target->GetType() == cmStateEnums::MODULE_LIBRARY) {
    std::string loader_flag_var =
      cmStrCat("CMAKE_SHARED_MODULE_LOADER_", this->LinkLanguage, "_FLAG");
    this->LoaderFlag = this->Makefile->GetDefinition(loader_flag_var);
  }

  // Get options needed to link libraries.
  if (cmValue flag = this->Makefile->GetDefinition(
        "CMAKE_" + this->LinkLanguage + "_LINK_LIBRARY_FLAG")) {
    this->LibLinkFlag = *flag;
  } else {
    this->LibLinkFlag =
      this->Makefile->GetSafeDefinition("CMAKE_LINK_LIBRARY_FLAG");
  }
  if (cmValue flag = this->Makefile->GetDefinition(
        "CMAKE_" + this->LinkLanguage + "_LINK_LIBRARY_FILE_FLAG")) {
    this->LibLinkFileFlag = *flag;
  } else {
    this->LibLinkFileFlag =
      this->Makefile->GetSafeDefinition("CMAKE_LINK_LIBRARY_FILE_FLAG");
  }
  if (cmValue suffix = this->Makefile->GetDefinition(
        "CMAKE_" + this->LinkLanguage + "_LINK_LIBRARY_SUFFIX")) {
    this->LibLinkSuffix = *suffix;
  } else {
    this->LibLinkSuffix =
      this->Makefile->GetSafeDefinition("CMAKE_LINK_LIBRARY_SUFFIX");
  }
  if (cmValue flag = this->Makefile->GetDefinition(
        "CMAKE_" + this->LinkLanguage + "_LINK_OBJECT_FILE_FLAG")) {
    this->ObjLinkFileFlag = *flag;
  } else {
    this->ObjLinkFileFlag =
      this->Makefile->GetSafeDefinition("CMAKE_LINK_OBJECT_FILE_FLAG");
  }

  // Get options needed to specify RPATHs.
  this->RuntimeUseChrpath = false;
  if (this->Target->GetType() != cmStateEnums::STATIC_LIBRARY) {
    const char* tType = ((this->Target->GetType() == cmStateEnums::EXECUTABLE)
                           ? "EXECUTABLE"
                           : "SHARED_LIBRARY");
    std::string rtVar =
      cmStrCat("CMAKE_", tType, "_RUNTIME_", this->LinkLanguage, "_FLAG");
    std::string rtSepVar = rtVar + "_SEP";
    this->RuntimeFlag = this->Makefile->GetSafeDefinition(rtVar);
    this->RuntimeSep = this->Makefile->GetSafeDefinition(rtSepVar);
    this->RuntimeAlways = (this->Makefile->GetSafeDefinition(
      "CMAKE_PLATFORM_REQUIRED_RUNTIME_PATH"));

    this->RuntimeUseChrpath = this->Target->IsChrpathUsed(config);

    // Get options needed to help find dependent libraries.
    std::string rlVar =
      cmStrCat("CMAKE_", tType, "_RPATH_LINK_", this->LinkLanguage, "_FLAG");
    this->RPathLinkFlag = this->Makefile->GetSafeDefinition(rlVar);
  }

  // Check if we need to include the runtime search path at link time.
  {
    std::string var = cmStrCat("CMAKE_SHARED_LIBRARY_LINK_",
                               this->LinkLanguage, "_WITH_RUNTIME_PATH");
    this->LinkWithRuntimePath = this->Makefile->IsOn(var);
  }

  // Define some Feature descriptors to handle standard library and object link
  if (!this->GetLibLinkFileFlag().empty()) {
    this->LibraryFeatureDescriptors.emplace(
      "__CMAKE_LINK_LIBRARY",
      LibraryFeatureDescriptor{
        "__CMAKE_LINK_LIBRARY",
        cmStrCat(this->GetLibLinkFileFlag(), "<LIBRARY>") });
  }
  if (!this->GetObjLinkFileFlag().empty()) {
    this->LibraryFeatureDescriptors.emplace(
      "__CMAKE_LINK_OBJECT",
      LibraryFeatureDescriptor{
        "__CMAKE_LINK_OBJECT",
        cmStrCat(this->GetObjLinkFileFlag(), "<LIBRARY>") });
  }
  if (!this->LoaderFlag->empty()) {
    // Define a Feature descriptor for the link of an executable with exports
    this->LibraryFeatureDescriptors.emplace(
      "__CMAKE_LINK_EXECUTABLE",
      LibraryFeatureDescriptor{ "__CMAKE_LINK_EXECUTABLE",
                                cmStrCat(this->LoaderFlag, "<LIBRARY>") });
  }
  // To link framewortk using a full path
  this->LibraryFeatureDescriptors.emplace(
    "__CMAKE_LINK_FRAMEWORK",
    LibraryFeatureDescriptor{ "__CMAKE_LINK_FRAMEWORK", "<LIBRARY>" });

  // Check the platform policy for missing soname case.
  this->NoSONameUsesPath =
    this->Makefile->IsOn("CMAKE_PLATFORM_USES_PATH_WHEN_NO_SONAME");

  // Get link type information.
  this->ComputeLinkTypeInfo();

  // Setup the link item parser.
  this->ComputeItemParserInfo();

  // Setup framework support.
  this->ComputeFrameworkInfo();

  // Choose a mode for dealing with shared library dependencies.
  this->SharedDependencyMode = SharedDepModeNone;
  if (this->Makefile->IsOn("CMAKE_LINK_DEPENDENT_LIBRARY_FILES")) {
    this->SharedDependencyMode = SharedDepModeLink;
  } else if (this->Makefile->IsOn("CMAKE_LINK_DEPENDENT_LIBRARY_DIRS")) {
    this->SharedDependencyMode = SharedDepModeLibDir;
  } else if (!this->RPathLinkFlag.empty()) {
    this->SharedDependencyMode = SharedDepModeDir;
    this->OrderDependentRPath = cm::make_unique<cmOrderDirectories>(
      this->GlobalGenerator, target, "dependent library path");
  }

  // Add the search path entries requested by the user to path ordering.
  std::vector<std::string> directories;
  this->Target->GetLinkDirectories(directories, config, this->LinkLanguage);
  this->OrderLinkerSearchPath->AddUserDirectories(directories);
  this->OrderRuntimeSearchPath->AddUserDirectories(directories);

  // Set up the implicit link directories.
  this->LoadImplicitLinkInfo();
  this->OrderLinkerSearchPath->SetImplicitDirectories(this->ImplicitLinkDirs);
  this->OrderRuntimeSearchPath->SetImplicitDirectories(this->ImplicitLinkDirs);
  if (this->OrderDependentRPath) {
    this->OrderDependentRPath->SetImplicitDirectories(this->ImplicitLinkDirs);
    this->OrderDependentRPath->AddLanguageDirectories(this->RuntimeLinkDirs);
  }

  // Decide whether to enable compatible library search path mode.
  // There exists code that effectively does
  //
  //    /path/to/libA.so -lB
  //
  // where -lB is meant to link to /path/to/libB.so.  This is broken
  // because it specified -lB without specifying a link directory (-L)
  // in which to search for B.  This worked in CMake 2.4 and below
  // because -L/path/to would be added by the -L/-l split for A.  In
  // order to support such projects we need to add the directories
  // containing libraries linked with a full path to the -L path.
  this->OldLinkDirMode =
    this->Target->GetPolicyStatusCMP0003() != cmPolicies::NEW;
  if (this->OldLinkDirMode) {
    // Construct a mask to not bother with this behavior for link
    // directories already specified by the user.
    this->OldLinkDirMask.insert(directories.begin(), directories.end());
  }

  this->CMP0060Warn = this->Makefile->PolicyOptionalWarningEnabled(
    "CMAKE_POLICY_WARNING_CMP0060");
}